

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pesPacket.h
# Opt level: O0

void set_pts_int(uint8_t *p,int64_t pts,int preffix)

{
  short sVar1;
  uint16_t val;
  int preffix_local;
  int64_t pts_local;
  uint8_t *p_local;
  
  *p = (char)preffix + ((byte)(pts >> 0x1e) & 7) * '\x02' + '\x01';
  sVar1 = (short)((pts >> 0xf & 0x7fffU) << 1) + 1;
  p[1] = (uint8_t)((ushort)sVar1 >> 8);
  p[2] = (uint8_t)sVar1;
  sVar1 = (short)((pts & 0x7fffU) << 1) + 1;
  p[3] = (uint8_t)((ushort)sVar1 >> 8);
  p[4] = (uint8_t)sVar1;
  return;
}

Assistant:

static void set_pts_int(uint8_t *p, const int64_t pts, const int preffix)
{
    p[0] = static_cast<uint8_t>(preffix + (((pts >> 30) & 0x07) << 1) + 1);
    uint16_t val = static_cast<uint16_t>(((pts >> 15) & 0x7fff) << 1) + 1;
    p[1] = val >> 8;
    p[2] = val & 0xff;

    val = static_cast<uint16_t>((pts & 0x7fff) << 1) + 1;
    p[3] = val >> 8;
    p[4] = val & 0xff;
}